

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

bool __thiscall
isotropic::scatter(isotropic *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  double dVar1;
  element_type *peVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  vec3 p;
  double local_48;
  double dStack_40;
  double local_38;
  
  vec3::random();
  dVar7 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  while ((dVar7 <= 1e-160 || (1.0 < dVar7))) {
    vec3::random();
    dVar7 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar7 = 1.0 / dVar7;
  dVar1 = r_in->tm;
  uVar3 = *(undefined4 *)(rec->p).e;
  uVar4 = *(undefined4 *)((long)(rec->p).e + 4);
  uVar5 = *(undefined4 *)((rec->p).e + 1);
  uVar6 = *(undefined4 *)((long)(rec->p).e + 0xc);
  (scattered->orig).e[2] = (rec->p).e[2];
  *(undefined4 *)(scattered->orig).e = uVar3;
  *(undefined4 *)((long)(scattered->orig).e + 4) = uVar4;
  *(undefined4 *)((scattered->orig).e + 1) = uVar5;
  *(undefined4 *)((long)(scattered->orig).e + 0xc) = uVar6;
  (scattered->dir).e[0] = local_48 * dVar7;
  (scattered->dir).e[1] = dStack_40 * dVar7;
  (scattered->dir).e[2] = dVar7 * local_38;
  scattered->tm = dVar1;
  peVar2 = (this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_texture[2])(SUB84(rec->u,0),rec->v,&local_48,peVar2,rec);
  attenuation->e[2] = local_38;
  attenuation->e[0] = local_48;
  attenuation->e[1] = dStack_40;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        scattered = ray(rec.p, random_unit_vector(), r_in.time());
        attenuation = tex->value(rec.u, rec.v, rec.p);
        return true;
    }